

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  Lit LVar8;
  vec<unsigned_int,_int> *pvVar9;
  anon_struct_4_5_613047fb_for_header aVar10;
  Clause CVar11;
  int iVar12;
  int iVar13;
  undefined7 in_register_00000031;
  anon_struct_4_5_613047fb_for_header *this_00;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  Queue<unsigned_int> *this_01;
  Var best;
  int local_6c;
  anon_struct_4_5_613047fb_for_header *local_68;
  uint local_5c;
  uint local_58;
  int local_54;
  ulong local_50;
  undefined4 local_44;
  Queue<unsigned_int> *local_40;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,verbose);
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x15a,"bool Minisat::SimpSolver::backwardSubsumptionCheck(bool)");
  }
  local_40 = &this->subsumption_queue;
  local_38 = &this->occurs;
  local_5c = 0;
  local_58 = 0;
  local_54 = 0;
  this_01 = local_40;
  do {
    iVar7 = (this->subsumption_queue).first;
    iVar13 = (this->subsumption_queue).end;
    iVar15 = 0;
    if (iVar13 < iVar7) {
      iVar15 = (this->subsumption_queue).buf.sz;
    }
    iVar12 = iVar15 + (iVar13 - iVar7);
    if ((iVar12 == 0 || SCARRY4(iVar15,iVar13 - iVar7) != iVar12 < 0) &&
       ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) {
      return true;
    }
    if ((this->super_Solver).asynch_interrupt == true) {
      if ((this_01->buf).data != (uint *)0x0) {
        (this->subsumption_queue).buf.sz = 0;
      }
      vec<unsigned_int,_int>::growTo(&this_01->buf,1);
      (this->subsumption_queue).first = 0;
      (this->subsumption_queue).end = 0;
      this->bwdsub_assigns = (this->super_Solver).trail.sz;
      return true;
    }
    if (iVar12 == 0) {
      iVar15 = this->bwdsub_assigns;
      if (iVar15 < (this->super_Solver).trail.sz) {
        this->bwdsub_assigns = iVar15 + 1;
        if ((this->super_Solver).ca.ra.sz <= this->bwdsub_tmpunit) {
LAB_001117de:
          __assert_fail("r < sz",
                        "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Alloc.h"
                        ,0x3f,
                        "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        puVar4 = (this->super_Solver).ca.ra.memory;
        puVar4[(ulong)this->bwdsub_tmpunit + 1] = (this->super_Solver).trail.data[iVar15].x;
        if ((this->super_Solver).ca.ra.sz <= this->bwdsub_tmpunit) goto LAB_001117de;
        Clause::calcAbstraction((Clause *)(puVar4 + this->bwdsub_tmpunit));
        Queue<unsigned_int>::insert(this_01,this->bwdsub_tmpunit);
        iVar7 = (this->subsumption_queue).first;
        iVar13 = (this->subsumption_queue).end;
      }
    }
    if (iVar7 == iVar13) {
      __assert_fail("first != end",
                    "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Queue.h"
                    ,0x2f,"T Minisat::Queue<unsigned int>::peek() const [T = unsigned int]");
    }
    uVar2 = (this->subsumption_queue).buf.data[iVar7];
    uVar16 = (ulong)uVar2;
    Queue<unsigned_int>::pop(this_01);
    if ((this->super_Solver).ca.ra.sz <= uVar2) goto LAB_001117de;
    puVar4 = (this->super_Solver).ca.ra.memory;
    aVar10 = *(anon_struct_4_5_613047fb_for_header *)(puVar4 + uVar16);
    if (((uint)aVar10 & 3) == 0) {
      local_68 = (anon_struct_4_5_613047fb_for_header *)(puVar4 + uVar16);
      if ((((char)local_44 != '\0') && (1 < (this->super_Solver).verbosity)) &&
         (iVar7 = local_54 * 0x26e978d5, iVar13 = local_54 + 1, uVar2 = local_54 * -0x60000000,
         local_54 = iVar13, (iVar7 + 0x10624d8U >> 3 | uVar2) < 0x418937)) {
        iVar7 = (this->subsumption_queue).end;
        iVar15 = 0;
        iVar13 = (this->subsumption_queue).first;
        if (iVar7 < iVar13) {
          iVar15 = (this->subsumption_queue).buf.sz;
        }
        printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
               (ulong)(uint)((iVar7 - iVar13) + iVar15),(ulong)local_58,(ulong)local_5c);
        aVar10 = *local_68;
      }
      iVar7 = (int)local_68[1] >> 1;
      if ((uint)aVar10 < 0x40) {
        if ((this->super_Solver).assigns.
            super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar7) {
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                        ,0x27,
                        "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        bVar1 = (this->super_Solver).assigns.
                super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data[iVar7].
                value;
        if (((SUB41(local_68[1],0) & 1 ^ bVar1) != l_True || (l_True & 2) != 0) &&
            (bVar1 & l_True & 2) == 0) {
          __assert_fail("c.size() > 1 || value(c[0]) == l_True",
                        "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                        ,0x173,"bool Minisat::SimpSolver::backwardSubsumptionCheck(bool)");
        }
      }
      CVar11.header = *local_68;
      local_6c = iVar7;
      if (0x3f < (uint)CVar11.header) {
        iVar13 = (this->occurs).occs.map.sz;
        pvVar9 = (this->occurs).occs.map.data;
        uVar14 = 1;
        do {
          iVar15 = (int)puVar4[uVar16 + uVar14 + 1] >> 1;
          if ((iVar13 <= iVar15) || (iVar13 <= iVar7)) {
            __assert_fail("has(k)",
                          "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                          ,0x28,
                          "V &Minisat::IntMap<int, Minisat::vec<unsigned int>>::operator[](K) [K = int, V = Minisat::vec<unsigned int>, MkIndex = Minisat::MkIndexDefault<int>]"
                         );
          }
          if (pvVar9[iVar15].sz < pvVar9[iVar7].sz) {
            CVar11.header = *local_68;
            iVar7 = iVar15;
            local_6c = iVar15;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (uint)CVar11.header >> 5);
      }
      pvVar9 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
               ::lookup(local_38,&local_6c);
      this_01 = local_40;
      if (0 < pvVar9->sz) {
        puVar4 = pvVar9->data;
        iVar7 = 0;
        this_00 = local_68;
        local_50 = uVar16;
        do {
          this_01 = local_40;
          if (((uint)*this_00 & 3) != 0) break;
          uVar2 = puVar4[iVar7];
          if ((this->super_Solver).ca.ra.sz <= uVar2) goto LAB_001117de;
          puVar5 = (this->super_Solver).ca.ra.memory;
          uVar3 = puVar5[uVar2];
          if (((((uVar3 & 3) == 0) && (uVar2 != (uint)uVar16)) &&
              ((this->subsumption_lim == -1 || ((int)(uVar3 >> 5) < this->subsumption_lim)))) &&
             (LVar8 = Clause::subsumes((Clause *)this_00,(Clause *)(puVar5 + uVar2)),
             this_00 = local_68, uVar16 = local_50, LVar8.x != -1)) {
            if (LVar8.x == -2) {
              local_58 = local_58 + 1;
              removeClause(this,puVar4[iVar7]);
              this_00 = local_68;
              uVar16 = local_50;
            }
            else {
              bVar6 = strengthenClause(this,puVar4[iVar7],(Lit)(LVar8.x ^ 1));
              if (!bVar6) {
                return false;
              }
              local_5c = local_5c + 1;
              iVar7 = iVar7 - (uint)(LVar8.x >> 1 == local_6c);
              this_00 = local_68;
              uVar16 = local_50;
            }
          }
          iVar7 = iVar7 + 1;
          this_01 = local_40;
        } while (iVar7 < pvVar9->sz);
      }
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}